

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O3

int bcf_sr_seek(bcf_srs_t *readers,char *seq,int pos)

{
  bcf_sr_regions_t *reg;
  _region_t *p_Var1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  auVar2 = _DAT_00159800;
  reg = readers->regions;
  if (pos == 0 && seq == (char *)0x0) {
    iVar4 = reg->nseqs;
    if (0 < (long)iVar4) {
      p_Var1 = reg->regs;
      lVar5 = (long)iVar4 + -1;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      lVar5 = 0;
      auVar7 = auVar7 ^ _DAT_00159800;
      auVar8 = _DAT_001597e0;
      auVar9 = _DAT_001597f0;
      do {
        auVar10 = auVar9 ^ auVar2;
        iVar3 = auVar7._4_4_;
        if ((bool)(~(auVar10._4_4_ == iVar3 && auVar7._0_4_ < auVar10._0_4_ || iVar3 < auVar10._4_4_
                    ) & 1)) {
          *(undefined4 *)((long)&p_Var1->creg + lVar5) = 0xffffffff;
        }
        if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
            auVar10._12_4_ <= auVar7._12_4_) {
          *(undefined4 *)((long)&p_Var1[1].creg + lVar5) = 0xffffffff;
        }
        auVar10 = auVar8 ^ auVar2;
        iVar11 = auVar10._4_4_;
        if (iVar11 <= iVar3 && (iVar11 != iVar3 || auVar10._0_4_ <= auVar7._0_4_)) {
          *(undefined4 *)((long)&p_Var1[2].creg + lVar5) = 0xffffffff;
          *(undefined4 *)((long)&p_Var1[3].creg + lVar5) = 0xffffffff;
        }
        lVar6 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar6 + 4;
        lVar6 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 4;
        auVar8._8_8_ = lVar6 + 4;
        lVar5 = lVar5 + 0x60;
      } while ((ulong)(iVar4 + 3U >> 2) * 0x60 != lVar5);
    }
    reg->iseq = 0;
  }
  else {
    bcf_sr_regions_overlap(reg,seq,pos,pos);
    if (0 < readers->nreaders) {
      lVar5 = 0;
      lVar6 = 0;
      iVar4 = 0;
      do {
        iVar3 = _reader_seek((bcf_sr_t *)((long)&readers->readers->file + lVar5),seq,pos,0x7ffffffe)
        ;
        iVar4 = iVar4 + iVar3;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x60;
      } while (lVar6 < readers->nreaders);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

int bcf_sr_seek(bcf_srs_t *readers, const char *seq, int pos)
{
    if ( !seq && !pos )
    {
        // seek to start
        bcf_sr_seek_start(readers);
        return 0;
    }

    bcf_sr_regions_overlap(readers->regions, seq, pos, pos);
    int i, nret = 0;
    for (i=0; i<readers->nreaders; i++)
    {
        nret += _reader_seek(&readers->readers[i],seq,pos,MAX_CSI_COOR-1);
    }
    return nret;
}